

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioParse.c
# Opt level: O1

int Mio_ParseCheckFormula(Mio_Gate_t *pGate,char *pForm)

{
  byte bVar1;
  int iVar2;
  Mio_Pin_t *pMVar3;
  char *__s1;
  ulong uVar4;
  int *piVar5;
  int fVisit [32];
  byte *local_b0;
  int local_a8 [32];
  
  local_a8[0x1c] = 0;
  local_a8[0x1d] = 0;
  local_a8[0x1e] = 0;
  local_a8[0x1f] = 0;
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  pMVar3 = Mio_GateReadPins(pGate);
  if (pMVar3 != (Mio_Pin_t *)0x0) {
    pMVar3 = Mio_GateReadPins(pGate);
    __s1 = Mio_PinReadName(pMVar3);
    iVar2 = strcmp(__s1,"*");
    if (iVar2 != 0) {
      do {
        bVar1 = *pForm;
        uVar4 = (ulong)bVar1;
        local_b0 = (byte *)pForm;
        if (uVar4 < 0x32) {
          if ((0x30fc300000000U >> (uVar4 & 0x3f) & 1) == 0) {
            if (uVar4 == 0) {
              pMVar3 = Mio_GateReadPins(pGate);
              if (pMVar3 == (Mio_Pin_t *)0x0) {
                return 1;
              }
              piVar5 = local_a8;
              do {
                if (*piVar5 == 0) {
                  return 0;
                }
                pMVar3 = Mio_PinReadNext(pMVar3);
                piVar5 = piVar5 + 1;
              } while (pMVar3 != (Mio_Pin_t *)0x0);
              return 1;
            }
            goto LAB_008ad070;
          }
        }
        else {
LAB_008ad070:
          if ((bVar1 != 0x5e) && (bVar1 != 0x7c)) {
            iVar2 = Mio_ParseCheckName(pGate,(char **)&local_b0);
            if (iVar2 == -1) {
              printf("Skipping gate \"%s\" because substring \"%s\" does not match with a pin name.\n"
                     ,pGate->pName,local_b0);
              return 0;
            }
            if (0x1f < iVar2) {
              __assert_fail("iPin < 32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioParse.c"
                            ,0x1e5,"int Mio_ParseCheckFormula(Mio_Gate_t *, char *)");
            }
            local_a8[iVar2] = 1;
          }
        }
        pForm = (char *)(local_b0 + 1);
      } while( true );
    }
  }
  return 1;
}

Assistant:

int Mio_ParseCheckFormula( Mio_Gate_t * pGate, char * pForm )
{
    Mio_Pin_t * pPin;
    char * pStr;
    int i, iPin, fVisit[32] = {0};
    if ( Mio_GateReadPins(pGate) == NULL || !strcmp(Mio_PinReadName(Mio_GateReadPins(pGate)), "*") )
        return 1;
/*
    // find the equality sign
    pForm = strstr( pForm, "=" );
    if ( pForm == NULL )
    {
        printf( "Skipping gate \"%s\" because formula \"%s\" has not equality sign (=).\n", pGate->pName, pForm );
        return 0;
    }
*/
//printf( "Checking gate %s\n", pGate->pName );

    for ( pStr = pForm; *pStr; pStr++ )
    {
        if ( *pStr == ' ' ||
             *pStr == MIO_EQN_SYM_OPEN ||   
             *pStr == MIO_EQN_SYM_CLOSE ||  
             *pStr == MIO_EQN_SYM_CONST0 || 
             *pStr == MIO_EQN_SYM_CONST1 || 
             *pStr == MIO_EQN_SYM_NEG ||    
             *pStr == MIO_EQN_SYM_NEGAFT || 
             *pStr == MIO_EQN_SYM_AND ||    
             *pStr == MIO_EQN_SYM_AND2 ||   
             *pStr == MIO_EQN_SYM_XOR ||    
             *pStr == MIO_EQN_SYM_OR ||     
             *pStr == MIO_EQN_SYM_OR2 
           )
           continue;
        // return the number of the pin which has this name
        iPin = Mio_ParseCheckName( pGate, &pStr );
        if ( iPin == -1 )
        {
            printf( "Skipping gate \"%s\" because substring \"%s\" does not match with a pin name.\n", pGate->pName, pStr );
            return 0;
        }
        assert( iPin < 32 );
        fVisit[iPin] = 1;
    }
    // check that all pins are used
    for ( pPin = Mio_GateReadPins(pGate), i = 0; pPin; pPin = Mio_PinReadNext(pPin), i++ )
        if ( fVisit[i] == 0 )
        {
//            printf( "Skipping gate \"%s\" because pin \"%s\" does not appear in the formula \"%s\".\n", pGate->pName, Mio_PinReadName(pPin), pForm );
            return 0;
        }
    return 1;
}